

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

FunctionDeclarationSyntax * __thiscall
slang::parsing::Parser::parseFunctionDeclaration
          (Parser *this,AttrList attributes,SyntaxKind functionKind,TokenKind endKind,
          SyntaxKind parentKind,bitmask<slang::parsing::detail::FunctionOptions> options)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> elements_00;
  Token semi_00;
  Token end_00;
  SyntaxNode *pSVar1;
  NamedBlockClauseSyntax *attributes_00;
  SyntaxFactory *this_00;
  FunctionDeclarationSyntax *pFVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  long in_RDI;
  undefined4 in_R9D;
  Token TVar3;
  bool in_stack_000000ff;
  Token *in_stack_00000100;
  TokenKind in_stack_0000010e;
  Parser *in_stack_00000110;
  Token nameToken;
  NamedBlockClauseSyntax *endBlockName;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> items;
  Token semi;
  SyntaxNode *savedPN;
  FunctionPrototypeSyntax *prototype;
  bool isConstructor;
  Token end;
  undefined4 in_stack_00000188;
  void **in_stack_fffffffffffffe48;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe50;
  bitmask<slang::parsing::detail::FunctionOptions> *in_stack_fffffffffffffe58;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe60;
  SyntaxKind in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Parser *in_stack_fffffffffffffe80;
  FunctionPrototypeSyntax *pFVar4;
  undefined4 in_stack_fffffffffffffe90;
  Parser *in_stack_fffffffffffffea8;
  TokenKind in_stack_fffffffffffffede;
  ParserBase *in_stack_fffffffffffffee0;
  TokenKind local_a0;
  bitmask<slang::parsing::detail::FunctionOptions> local_58;
  underlying_type local_54;
  FunctionPrototypeSyntax *local_50;
  Info *local_40;
  FunctionPrototypeSyntax *local_38;
  undefined4 local_2c;
  undefined4 local_24;
  
  local_2c = in_R9D;
  local_24 = in_ECX;
  Token::Token((Token *)in_stack_fffffffffffffe50);
  bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_58,AllowImplicitReturn);
  local_54 = (underlying_type)
             bitmask<slang::parsing::detail::FunctionOptions>::operator|
                       (in_stack_fffffffffffffe58,
                        (bitmask<slang::parsing::detail::FunctionOptions> *)
                        in_stack_fffffffffffffe50);
  local_50 = parseFunctionPrototype
                       (this,functionKind,options,(bool *)CONCAT44(parentKind,in_stack_00000188));
  pSVar1 = std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                     ((SyntaxNode **)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  ParserBase::expect(in_stack_fffffffffffffee0,in_stack_fffffffffffffede);
  parseBlockItems(in_stack_00000110,in_stack_0000010e,in_stack_00000100,in_stack_000000ff);
  attributes_00 = parseNamedBlockClause(in_stack_fffffffffffffea8);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0xc07754);
  TVar3 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffffe80);
  local_a0 = TVar3.kind;
  if ((local_a0 == Identifier) || (local_a0 == NewKeyword)) {
    TVar3.info._0_4_ = in_stack_fffffffffffffe90;
    TVar3.kind = (short)in_RDX;
    TVar3._2_1_ = (char)((ulong)in_RDX >> 0x10);
    TVar3.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
    TVar3.rawLen = (int)((ulong)in_RDX >> 0x20);
    TVar3.info._4_4_ = local_2c;
    checkBlockNames(in_stack_fffffffffffffe80,TVar3,
                    (NamedBlockClauseSyntax *)
                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  *(SyntaxNode **)(in_RDI + 0xe8) = pSVar1;
  this_00 = (SyntaxFactory *)(in_RDI + 0xe0);
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe60._M_extent_value;
  elements._M_ptr = (pointer)in_stack_fffffffffffffe58;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffe50,elements);
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffe60._M_extent_value;
  elements_00._M_ptr = (pointer)in_stack_fffffffffffffe58;
  pFVar4 = local_50;
  slang::syntax::SyntaxList<slang::syntax::SyntaxNode>::SyntaxList
            ((SyntaxList<slang::syntax::SyntaxNode> *)in_stack_fffffffffffffe50,elements_00);
  semi_00.rawLen = local_24;
  semi_00.kind = (short)in_stack_fffffffffffffe78;
  semi_00._2_1_ = (char)((uint)in_stack_fffffffffffffe78 >> 0x10);
  semi_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffe78 >> 0x18);
  semi_00.info = (Info *)pFVar4;
  end_00.info = local_40;
  end_00.kind = (short)in_RDI;
  end_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
  end_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  end_00.rawLen = (int)((ulong)in_RDI >> 0x20);
  pFVar2 = slang::syntax::SyntaxFactory::functionDeclaration
                     (this_00,in_stack_fffffffffffffe6c,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes_00,local_38,
                      semi_00,(SyntaxList<slang::syntax::SyntaxNode> *)
                              CONCAT44(local_2c,in_stack_fffffffffffffe90),end_00,
                      (NamedBlockClauseSyntax *)local_38);
  return pFVar2;
}

Assistant:

FunctionDeclarationSyntax& Parser::parseFunctionDeclaration(AttrList attributes,
                                                            SyntaxKind functionKind,
                                                            TokenKind endKind,
                                                            SyntaxKind parentKind,
                                                            bitmask<FunctionOptions> options) {
    Token end;
    bool isConstructor;
    auto& prototype = parseFunctionPrototype(parentKind,
                                             options | FunctionOptions::AllowImplicitReturn,
                                             &isConstructor);

    // If the function returns a declared enum type, save it off here
    // so that we don't suck it into the body.
    auto savedPN = std::exchange(previewNode, nullptr);

    auto semi = expect(TokenKind::Semicolon);
    auto items = parseBlockItems(endKind, end, isConstructor);
    auto endBlockName = parseNamedBlockClause();

    Token nameToken = prototype.name->getLastToken();
    if (nameToken.kind == TokenKind::Identifier || nameToken.kind == TokenKind::NewKeyword)
        checkBlockNames(nameToken, endBlockName);

    previewNode = savedPN;
    return factory.functionDeclaration(functionKind, attributes, prototype, semi, items, end,
                                       endBlockName);
}